

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vtab_nochange(sqlite3_context *p)

{
  uint uVar1;
  Mem *pMVar2;
  
  pMVar2 = p->pOut;
  uVar1._0_2_ = pMVar2->flags;
  uVar1._2_1_ = pMVar2->enc;
  uVar1._3_1_ = pMVar2->eSubtype;
  return (int)((~uVar1 & 0x401) == 0);
}

Assistant:

SQLITE_API int sqlite3_vtab_nochange(sqlite3_context *p){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return 0;
#else
  assert( p );
#endif
  return sqlite3_value_nochange(p->pOut);
}